

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O1

void QXkbCommon::verifyHasLatinLayout(xkb_keymap *keymap)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  QLoggingCategory *pQVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  bool bVar8;
  bool bVar9;
  xkb_keysym_t *keysyms;
  char local_60 [24];
  char *local_48;
  int *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = xkb_keymap_num_layouts();
  uVar2 = xkb_keymap_min_keycode(keymap);
  uVar3 = xkb_keymap_max_keycode(keymap);
  local_40 = (int *)0x0;
  bVar9 = uVar1 != 0;
  if (bVar9) {
    uVar6 = 0;
    iVar5 = 0;
    do {
      uVar7 = uVar2;
      bVar8 = uVar2 < uVar3;
      if (uVar2 < uVar3) {
        do {
          xkb_keymap_key_get_syms_by_level(keymap,uVar7,uVar6,0,&local_40);
          if (local_40 != (int *)0x0) {
            iVar5 = iVar5 + (uint)(*local_40 - 0x20U < 0xe0);
          }
          if (10 < iVar5) break;
          uVar7 = uVar7 + 1;
          bVar8 = uVar7 < uVar3;
        } while (uVar7 != uVar3);
      }
      if (bVar8) {
        if (bVar9) goto LAB_00660a6e;
        break;
      }
      uVar6 = uVar6 + 1;
      bVar9 = uVar6 < uVar1;
    } while (uVar6 != uVar1);
  }
  pQVar4 = QtPrivateLogging::lcQpaKeyMapper();
  if (((pQVar4->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_48 = pQVar4->name;
    local_60[0] = '\x02';
    local_60[1] = '\0';
    local_60[2] = '\0';
    local_60[3] = '\0';
    local_60[4] = '\0';
    local_60[5] = '\0';
    local_60[6] = '\0';
    local_60[7] = '\0';
    local_60[8] = '\0';
    local_60[9] = '\0';
    local_60[10] = '\0';
    local_60[0xb] = '\0';
    local_60[0xc] = '\0';
    local_60[0xd] = '\0';
    local_60[0xe] = '\0';
    local_60[0xf] = '\0';
    local_60[0x10] = '\0';
    local_60[0x11] = '\0';
    local_60[0x12] = '\0';
    local_60[0x13] = '\0';
    local_60[0x14] = '\0';
    local_60[0x15] = '\0';
    local_60[0x16] = '\0';
    local_60[0x17] = '\0';
    QMessageLogger::debug(local_60,"no keyboard layouts with latin keys present");
  }
LAB_00660a6e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXkbCommon::verifyHasLatinLayout(xkb_keymap *keymap)
{
    const xkb_layout_index_t layoutCount = xkb_keymap_num_layouts(keymap);
    const xkb_keycode_t minKeycode = xkb_keymap_min_keycode(keymap);
    const xkb_keycode_t maxKeycode = xkb_keymap_max_keycode(keymap);

    const xkb_keysym_t *keysyms = nullptr;
    int nrLatinKeys = 0;
    for (xkb_layout_index_t layout = 0; layout < layoutCount; ++layout) {
        for (xkb_keycode_t code = minKeycode; code < maxKeycode; ++code) {
            xkb_keymap_key_get_syms_by_level(keymap, code, layout, 0, &keysyms);
            if (keysyms && isLatin1(keysyms[0]))
                nrLatinKeys++;
            if (nrLatinKeys > 10) // arbitrarily chosen threshold
                return;
        }
    }
    // This means that lookupLatinKeysym() will not find anything and latin
    // key shortcuts might not work. This is a bug in the affected desktop
    // environment. Usually can be solved via system settings by adding e.g. 'us'
    // layout to the list of selected layouts, or by using command line, "setxkbmap
    // -layout rus,en". The position of latin key based layout in the list of the
    // selected layouts is irrelevant. Properly functioning desktop environments
    // handle this behind the scenes, even if no latin key based layout has been
    // explicitly listed in the selected layouts.
    qCDebug(lcQpaKeyMapper, "no keyboard layouts with latin keys present");
}